

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Ptr<Catch::TestCaseTracking::ITracker> * __thiscall
Catch::Ptr<Catch::TestCaseTracking::ITracker>::operator=
          (Ptr<Catch::TestCaseTracking::ITracker> *this,ITracker *p)

{
  Ptr<Catch::TestCaseTracking::ITracker> local_20;
  
  if (p != (ITracker *)0x0) {
    (*(p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable[2])(p)
    ;
  }
  local_20 = (Ptr<Catch::TestCaseTracking::ITracker>)this->m_p;
  this->m_p = p;
  ~Ptr(&local_20);
  return this;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }